

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O3

uint32_t SSL_get_dtls_handshake_read_seq(SSL *ssl)

{
  uint uVar1;
  
  if (ssl->method->is_dtls != false) {
    uVar1 = 0x10000;
    if ((undefined1  [1016])((undefined1  [1016])*ssl->d1 & (undefined1  [1016])0x10) ==
        (undefined1  [1016])0x0) {
      uVar1 = (uint)ssl->d1->handshake_read_seq;
    }
    return uVar1;
  }
  abort();
}

Assistant:

uint32_t SSL_get_dtls_handshake_read_seq(const SSL *ssl) {
  BSSL_CHECK(SSL_is_dtls(ssl));
  return ssl->d1->handshake_read_overflow
             ? uint32_t{0x10000}
             : uint32_t{ssl->d1->handshake_read_seq};
}